

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O0

void ihevc_intra_pred_luma_dc
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  int iVar2;
  WORD32 three_nt;
  WORD32 two_nt;
  WORD32 log2nt;
  WORD32 col;
  WORD32 row;
  WORD32 i;
  WORD32 three_dc_val;
  WORD32 two_dc_val;
  WORD32 dc_val;
  WORD32 acc_dc;
  WORD32 mode_local;
  WORD32 nt_local;
  WORD32 dst_strd_local;
  UWORD8 *pu1_dst_local;
  WORD32 src_strd_local;
  UWORD8 *pu1_ref_local;
  
  log2nt._0_1_ = '\x05';
  switch(nt) {
  case 4:
    log2nt._0_1_ = '\x02';
    break;
  default:
    break;
  case 8:
    log2nt._0_1_ = '\x03';
    break;
  case 0x10:
    log2nt._0_1_ = '\x04';
    break;
  case 0x20:
    log2nt._0_1_ = '\x05';
  }
  iVar1 = nt * 2;
  acc_dc = 0;
  for (i = nt; iVar2 = iVar1, i < iVar1; i = i + 1) {
    acc_dc = (uint)pu1_ref[i] + acc_dc;
  }
  while (i = iVar2 + 1, i <= nt * 3) {
    acc_dc = (uint)pu1_ref[i] + acc_dc;
    iVar2 = i;
  }
  iVar2 = acc_dc + nt >> (char)log2nt + 1;
  if (nt == 0x20) {
    for (row = 0; row < 0x20; row = row + 1) {
      for (col = 0; col < 0x20; col = col + 1) {
        pu1_dst[row * dst_strd + col] = (UWORD8)iVar2;
      }
    }
  }
  else {
    *pu1_dst = (UWORD8)((int)((uint)pu1_ref[iVar1 + -1] + iVar2 * 2 + (uint)pu1_ref[iVar1 + 1] + 2)
                       >> 2);
    for (col = 1; col < nt; col = col + 1) {
      pu1_dst[col] = (UWORD8)((int)((uint)pu1_ref[iVar1 + 1 + col] + iVar2 * 3 + 2) >> 2);
    }
    for (row = 1; row < nt; row = row + 1) {
      pu1_dst[row * dst_strd] =
           (UWORD8)((int)((uint)pu1_ref[(iVar1 + -1) - row] + iVar2 * 3 + 2) >> 2);
    }
    for (row = 1; row < nt; row = row + 1) {
      for (col = 1; col < nt; col = col + 1) {
        pu1_dst[row * dst_strd + col] = (UWORD8)iVar2;
      }
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_dc(UWORD8 *pu1_ref,
                              WORD32 src_strd,
                              UWORD8 *pu1_dst,
                              WORD32 dst_strd,
                              WORD32 nt,
                              WORD32 mode)
{

    WORD32 acc_dc;
    WORD32 dc_val, two_dc_val, three_dc_val;
    WORD32 i;
    WORD32 row, col;
    WORD32 log2nt = 5;
    WORD32 two_nt, three_nt;
    UNUSED(mode);
    UNUSED(src_strd);
    switch(nt)
    {
        case 32:
            log2nt = 5;
            break;
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }
    two_nt = 2 * nt;
    three_nt = 3 * nt;

    acc_dc = 0;
    /* Calculate DC value for the transform block */
    for(i = nt; i < two_nt; i++)
        acc_dc += pu1_ref[i];

    for(i = (two_nt + 1); i <= three_nt; i++)
        acc_dc += pu1_ref[i];

    dc_val = (acc_dc + nt) >> (log2nt + 1);

    two_dc_val = 2 * dc_val;
    three_dc_val = 3 * dc_val;


    if(nt == 32)
    {
        for(row = 0; row < nt; row++)
            for(col = 0; col < nt; col++)
                pu1_dst[(row * dst_strd) + col] = dc_val;
    }
    else
    {
        /* DC filtering for the first top row and first left column */
        pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                        >> 2);

        for(col = 1; col < nt; col++)
            pu1_dst[col] = (pu1_ref[two_nt + 1 + col] + three_dc_val + 2) >> 2;

        for(row = 1; row < nt; row++)
            pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                            >> 2;

        /* Fill the remaining rows with DC value*/
        for(row = 1; row < nt; row++)
            for(col = 1; col < nt; col++)
                pu1_dst[(row * dst_strd) + col] = dc_val;
    }
}